

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

void Abc_NtkFinMiterCollect(Abc_Ntk_t *pNtk,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes)

{
  ulong uVar1;
  long *plVar2;
  int iVar3;
  int *__s;
  int iVar4;
  long lVar5;
  
  vCis->nSize = 0;
  vNodes->nSize = 0;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar3 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar3 + 500;
    iVar4 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar4) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar4;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar3) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar4;
  }
  iVar3 = pNtk->nTravIds;
  pNtk->nTravIds = iVar3 + 1;
  if (iVar3 < 0x3fffffff) {
    iVar3 = vCos->nSize;
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        iVar4 = vCos->pArray[lVar5];
        if (((long)iVar4 < 0) || (pNtk->vObjs->nSize <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        plVar2 = (long *)pNtk->vObjs->pArray[iVar4];
        if (plVar2 != (long *)0x0) {
          Abc_NtkFinMiterCollect_rec
                    (*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8),vCis,
                     vNodes);
          iVar3 = vCos->nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar3);
    }
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkFinMiterCollect( Abc_Ntk_t * pNtk, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pObj; int i;
    Vec_IntClear( vCis );
    Vec_IntClear( vNodes );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachObjVec( vCos, pNtk, pObj, i )
        Abc_NtkFinMiterCollect_rec( Abc_ObjFanin0(pObj), vCis, vNodes );
}